

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.cpp
# Opt level: O2

string * __thiscall
lossless_neural_sound::audio::Audio_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,Audio_error_category *this,int condition)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (condition == 3) {
    pcVar2 = "unsupported";
    paVar1 = &local_b;
  }
  else if (condition == 2) {
    pcVar2 = "corrupt file";
    paVar1 = &local_a;
  }
  else if (condition == 1) {
    pcVar2 = "format does not match";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "unknown error";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Audio_error_category::message(int condition) const
{
    switch(static_cast<Audio_error_code>(condition))
    {
    case Audio_error_code::format_does_not_match:
        return "format does not match";
    case Audio_error_code::corrupt_file:
        return "corrupt file";
    case Audio_error_code::unsupported:
        return "unsupported";
    }
    return "unknown error";
}